

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseInline(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  TidyTagId TVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  Node *pNVar4;
  Bool BVar5;
  int iVar6;
  Node *parent;
  Node *pNVar7;
  Dict *pDVar8;
  tmbstr ptVar9;
  Node *pNVar10;
  Node *pNVar11;
  Node **ppNVar12;
  uint uVar13;
  uint code;
  GetTokenMode mode_00;
  
  if ((element->tag->model & 1) == 0) {
    pLVar2 = doc->lexer;
    BVar5 = prvTidynodeHasCM(element,8);
    if (((BVar5 == no) &&
        (((element == (Node *)0x0 || (element->tag == (Dict *)0x0)) ||
         (element->tag->id != TidyTag_DT)))) ||
       (BVar5 = prvTidynodeHasCM(element,0x20000), BVar5 != no)) {
      BVar5 = prvTidynodeHasCM(element,0x10);
      if (BVar5 != no) {
        prvTidyPushInline(doc,element);
      }
    }
    else {
      prvTidyInlineDup(doc,(Node *)0x0);
    }
    if (((element != (Node *)0x0) && (pDVar8 = element->tag, pDVar8 != (Dict *)0x0)) &&
       ((uVar13 = 4, pDVar8->id == TidyTag_NOBR ||
        ((pDVar8 != (Dict *)0x0 && (uVar13 = 8, pDVar8->id == TidyTag_FONT)))))) {
      doc->badLayout = doc->badLayout | uVar13;
    }
    mode_00 = (mode == Preformatted) + MixedContent;
    pNVar7 = prvTidyGetToken(doc,mode_00);
    while (pNVar7 != (Node *)0x0) {
      pDVar8 = element->tag;
      if ((pNVar7->tag == pDVar8) && (pNVar7->type == EndTag)) {
        if ((pDVar8->model & 0x10) != 0) {
          prvTidyPopInline(doc,pNVar7);
        }
        prvTidyFreeNode(doc,pNVar7);
        if (mode != Preformatted) {
          TrimSpaces(doc,element);
        }
        if (((((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
             (element->tag->id == TidyTag_FONT)) &&
            ((pNVar7 = element->content, pNVar7 != (Node *)0x0 && (pNVar7 == element->last)))) &&
           ((pNVar7->tag != (Dict *)0x0 && (pNVar7->tag->id == TidyTag_A)))) {
          pNVar7->parent = element->parent;
          pNVar7->next = element->next;
          pNVar7->prev = element->prev;
          element->prev = (Node *)0x0;
          element->next = (Node *)0x0;
          element->parent = pNVar7;
          element->content = pNVar7->content;
          element->last = pNVar7->last;
          pNVar7->content = element;
          prvTidyFixNodeLinks(pNVar7);
          prvTidyFixNodeLinks(element);
        }
        element->closed = yes;
        goto LAB_0013ff17;
      }
      if ((((pNVar7->tag == pDVar8) && (pNVar7->type == StartTag)) &&
          ((BVar5 = prvTidyIsPushed(doc,pNVar7), BVar5 != no &&
           (((pNVar7->implicit == no && (element->implicit == no)) &&
            (pDVar8 = pNVar7->tag, pDVar8 != (Dict *)0x0)))))) && ((pDVar8->model & 0x10) != 0)) {
        TVar1 = pDVar8->id;
        if ((((TVar1 - TidyTag_Q < 0x15) && ((0x18a001U >> (TVar1 - TidyTag_Q & 0x1f) & 1) != 0)) ||
            ((TVar1 < TidyTag_FORM && ((0x1000002002U >> ((ulong)TVar1 & 0x3f) & 1) != 0)))) ||
           (*(int *)((doc->config).value + 9) == 0)) goto LAB_0013f42f;
        if ((((element->content == (Node *)0x0) || (pNVar7->attributes != (AttVal *)0x0)) ||
            (BVar5 = prvTidynodeIsText(element->last), BVar5 == no)) ||
           (BVar5 = prvTidyTextNodeEndWithSpace(doc->lexer,element->last), BVar5 != no)) {
          code = 0x264;
          if ((pNVar7->attributes == (AttVal *)0x0) || (element->attributes == (AttVal *)0x0))
          goto LAB_0013f467;
          goto LAB_0013f477;
        }
        prvTidyReport(doc,element,pNVar7,0x232);
        pNVar7->type = EndTag;
LAB_0013fc26:
        prvTidyUngetToken(doc);
      }
      else {
LAB_0013f42f:
        BVar5 = prvTidyIsPushed(doc,pNVar7);
        if (((BVar5 != no) && (pNVar7->type == StartTag)) &&
           ((pNVar7->tag != (Dict *)0x0 && (pNVar7->tag->id == TidyTag_Q)))) {
          iVar6 = prvTidyHTMLVersion(doc);
          code = 0x265;
          if (iVar6 != 0x20000) {
LAB_0013f467:
            prvTidyReport(doc,element,pNVar7,code);
          }
        }
LAB_0013f477:
        BVar5 = prvTidynodeIsText(pNVar7);
        if (BVar5 == no) {
          BVar5 = InsertMisc(element,pNVar7);
          if (BVar5 != no) goto LAB_0013f6ea;
          pDVar8 = pNVar7->tag;
          if (pDVar8 == (Dict *)0x0) goto LAB_0013f6ca;
          if (pDVar8->id == TidyTag_HTML) {
            BVar5 = prvTidynodeIsElement(pNVar7);
            if (BVar5 != no) goto LAB_0013f6ca;
LAB_0013ff6e:
            prvTidyUngetToken(doc);
            goto LAB_0013ff76;
          }
          if (pDVar8 != (Dict *)0x0) {
            if ((pDVar8->id == TidyTag_P) && (pNVar7->type == StartTag)) {
              if ((mode == Preformatted) ||
                 (((element != (Node *)0x0 && (element->tag != (Dict *)0x0)) &&
                  (element->tag->id == TidyTag_DT)))) {
LAB_0013f5b8:
                pDVar8 = prvTidyLookupTagDef(TidyTag_BR);
                pNVar7->tag = pDVar8;
                (*doc->allocator->vtbl->free)(doc->allocator,pNVar7->element);
                ptVar9 = prvTidytmbstrdup(doc->allocator,"br");
                pNVar7->element = ptVar9;
                TrimSpaces(doc,element);
                pNVar7->parent = element;
                pNVar10 = element->last;
                pNVar7->prev = pNVar10;
                ppNVar12 = &pNVar10->next;
                if (pNVar10 == (Node *)0x0) {
                  ppNVar12 = &element->content;
                }
                *ppNVar12 = pNVar7;
                goto LAB_0013f4c6;
              }
              for (pNVar10 = element->parent; pNVar10 != (Node *)0x0; pNVar10 = pNVar10->parent) {
                if ((pNVar10->tag != (Dict *)0x0) && (pNVar10->tag->id == TidyTag_DT))
                goto LAB_0013f5b8;
              }
            }
            if (pDVar8 != (Dict *)0x0) {
              if (((pDVar8->id == TidyTag_P) && (element != (Node *)0x0 && pNVar7->type == StartTag)
                  ) && ((element->tag != (Dict *)0x0 && (element->tag->id == TidyTag_ADDRESS)))) {
                prvTidyConstrainVersion(doc,0xfffffedb);
                pNVar7->parent = element;
                pNVar10 = element->last;
                ppNVar12 = &pNVar10->next;
                if (pNVar10 == (Node *)0x0) {
                  ppNVar12 = &element->content;
                }
                pNVar7->prev = pNVar10;
                *ppNVar12 = pNVar7;
                element->last = pNVar7;
                (*pNVar7->tag->parser)(doc,pNVar7,mode_00);
                goto LAB_0013f6ea;
              }
              if (pDVar8 == (Dict *)0x0) goto LAB_0013f6ca;
              TVar1 = pDVar8->id;
              if (TVar1 == TidyTag_BR) {
                if (pNVar7->type == EndTag) {
                  pNVar7->type = StartTag;
                }
              }
              else if (TVar1 == TidyTag_PARAM) goto LAB_0013f6ca;
              if (pNVar7->type != EndTag) goto LAB_0013f7b9;
              if (TVar1 == TidyTag_P) {
                for (pNVar10 = element->parent; pNVar10 != (Node *)0x0; pNVar10 = pNVar10->parent) {
                  if ((pNVar10->tag != (Dict *)0x0) && (pNVar10->tag->id == TidyTag_P))
                  goto LAB_0013f7b9;
                }
                prvTidyCoerceNode(doc,pNVar7,TidyTag_BR,no,no);
                TrimSpaces(doc,element);
                pNVar7->parent = element;
                pNVar10 = element->last;
                pNVar7->prev = pNVar10;
                ppNVar12 = &pNVar10->next;
                if (pNVar10 == (Node *)0x0) {
                  ppNVar12 = &element->content;
                }
                *ppNVar12 = pNVar7;
                element->last = pNVar7;
                pNVar10 = prvTidyInferredTag(doc,TidyTag_BR);
                pNVar10->parent = element;
                pNVar7 = element->last;
                pNVar10->prev = pNVar7;
                ppNVar12 = &pNVar7->next;
                if (pNVar7 == (Node *)0x0) {
                  ppNVar12 = &element->content;
                }
                *ppNVar12 = pNVar10;
                element->last = pNVar10;
                goto LAB_0013f6ea;
              }
              if (TVar1 == TidyTag_BR) {
                pNVar7->type = StartTag;
LAB_0013f7b9:
                BVar5 = prvTidynodeHasCM(pNVar7,0x4000);
                if ((BVar5 == no) || (BVar5 = prvTidynodeHasCM(element,0x4000), BVar5 == no)) {
                  pDVar8 = pNVar7->tag;
                  if ((pDVar8 != (Dict *)0x0) &&
                     ((pDVar8->id == TidyTag_A && (pNVar7->implicit == no)))) {
                    if ((element != (Node *)0x0) &&
                       ((element->tag != (Dict *)0x0 && (element->tag->id == TidyTag_A)))) {
LAB_0013f919:
                      if ((pNVar7->type != EndTag) &&
                         ((pNVar7->attributes == (AttVal *)0x0 &&
                          (*(int *)((doc->config).value + 9) != 0)))) {
                        pNVar7->type = EndTag;
                        prvTidyReport(doc,element,pNVar7,0x232);
                        goto LAB_0013fc26;
                      }
                      prvTidyUngetToken(doc);
                      prvTidyReport(doc,element,pNVar7,0x259);
                      goto LAB_0013ff76;
                    }
                    for (pNVar10 = element->parent; pNVar10 != (Node *)0x0;
                        pNVar10 = pNVar10->parent) {
                      if ((pNVar10->tag != (Dict *)0x0) && (pNVar10->tag->id == TidyTag_A))
                      goto LAB_0013f919;
                    }
                  }
                  pDVar3 = element->tag;
                  uVar13 = pDVar3->model;
                  if ((pDVar8 != (Dict *)0x0) && ((uVar13 & 0x4000) != 0)) {
                    if (pDVar8->id == TidyTag_CENTER) {
LAB_0013f82d:
                      BVar5 = prvTidynodeIsElement(pNVar7);
                      if (BVar5 == no) goto LAB_0013f6ca;
                      prvTidyReport(doc,element,pNVar7,0x27e);
                      if (element->content == (Node *)0x0) {
                        InsertNodeAsParent(element,pNVar7);
                        goto LAB_0013f6ea;
                      }
                      pNVar10 = element->parent;
                      pNVar7->parent = pNVar10;
                      if ((pNVar10 == (Node *)0x0) || (pNVar10->last != element)) {
                        pNVar10 = element->next;
                        pNVar7->next = pNVar10;
                        if (pNVar10 != (Node *)0x0) {
                          ppNVar12 = &pNVar10->prev;
                          goto LAB_0013fccc;
                        }
                      }
                      else {
                        ppNVar12 = &pNVar10->last;
LAB_0013fccc:
                        *ppNVar12 = pNVar7;
                      }
                      element->next = pNVar7;
                      pNVar7->prev = element;
                      if (mode != Preformatted) {
                        TrimSpaces(doc,element);
                      }
                      element = prvTidyCloneNode(doc,element);
                      element->parent = pNVar7;
                      pNVar10 = pNVar7->last;
                      element->prev = pNVar10;
                      ppNVar12 = &pNVar10->next;
                      if (pNVar10 == (Node *)0x0) {
                        ppNVar12 = &pNVar7->content;
                      }
                      *ppNVar12 = element;
                      pNVar7->last = element;
                      goto LAB_0013f6ea;
                    }
                    if (pDVar8 == (Dict *)0x0) goto LAB_0013f9e7;
                    if (pDVar8->id == TidyTag_DIV) goto LAB_0013f82d;
                    if ((pDVar8 == (Dict *)0x0) || (pDVar8->id != TidyTag_HR)) goto LAB_0013f9e7;
                    BVar5 = prvTidynodeIsElement(pNVar7);
                    if (BVar5 == no) goto LAB_0013f6ca;
                    prvTidyReport(doc,element,pNVar7,0x27e);
                    pNVar10 = element->content;
                    pNVar4 = element->parent;
                    pNVar7->parent = pNVar4;
                    if (pNVar10 == (Node *)0x0) {
                      pNVar7->next = element;
                      pNVar7->prev = element->prev;
                      element->prev = pNVar7;
                      if (pNVar7->prev != (Node *)0x0) {
                        pNVar7->prev->next = pNVar7;
                      }
                      if (pNVar4->content == element) {
                        pNVar4->content = pNVar7;
                      }
                      goto LAB_0013f6ea;
                    }
                    if ((pNVar4 == (Node *)0x0) || (pNVar4->last != element)) {
                      pNVar10 = element->next;
                      pNVar7->next = pNVar10;
                      if (pNVar10 != (Node *)0x0) {
                        ppNVar12 = &pNVar10->prev;
                        goto LAB_0013fe2f;
                      }
                    }
                    else {
                      ppNVar12 = &pNVar4->last;
LAB_0013fe2f:
                      *ppNVar12 = pNVar7;
                    }
                    element->next = pNVar7;
                    pNVar7->prev = element;
                    if (mode != Preformatted) {
                      TrimSpaces(doc,element);
                    }
                    element = prvTidyCloneNode(doc,element);
                    pNVar10 = pNVar7->parent;
                    element->parent = pNVar10;
                    if ((pNVar10 == (Node *)0x0) || (pNVar10->last != pNVar7)) {
                      pNVar10 = pNVar7->next;
                      element->next = pNVar10;
                      if (pNVar10 != (Node *)0x0) {
                        ppNVar12 = &pNVar10->prev;
                        goto LAB_0013fe81;
                      }
                    }
                    else {
                      ppNVar12 = &pNVar10->last;
LAB_0013fe81:
                      *ppNVar12 = element;
                    }
                    pNVar7->next = element;
                    element->prev = pNVar7;
                    goto LAB_0013f6ea;
                  }
LAB_0013f9e7:
                  if ((((pDVar3 == (Dict *)0x0 || element == (Node *)0x0) || (pDVar8 == (Dict *)0x0)
                       ) || (pDVar3->id != TidyTag_DT)) || (pDVar8->id != TidyTag_HR)) {
                    pNVar10 = element;
                    if (pNVar7->type == EndTag) {
                      while (pNVar10 = pNVar10->parent, pNVar10 != (Node *)0x0) {
                        if (pDVar8 == pNVar10->tag) {
                          if ((-1 < (short)uVar13) && (element->implicit == no)) {
                            prvTidyReport(doc,element,pNVar7,0x259);
                          }
                          BVar5 = prvTidyIsPushedLast(doc,element,pNVar7);
                          if (BVar5 == no) goto LAB_0013ff6e;
                          goto LAB_0013ff63;
                        }
                      }
                    }
                    if (((uVar13 & 0x20000) == 0 && (pDVar8->model & 0x10) == 0) &&
                       (((pDVar3 == (Dict *)0x0 || element == (Node *)0x0 || (pDVar8 == (Dict *)0x0)
                         ) || ((pDVar3->id != TidyTag_SPAN || (pDVar8->id != TidyTag_META)))))) {
                      BVar5 = prvTidynodeIsElement(pNVar7);
                      if (BVar5 == no) goto LAB_0013f6ca;
                      if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
                         (element->tag->id != TidyTag_DATALIST)) {
                        if ((element->tag->model & 0x8000) == 0) {
                          prvTidyReport(doc,element,pNVar7,0x259);
                        }
                      }
                      else {
                        prvTidyConstrainVersion(doc,0xfff9ffff);
                      }
                      uVar13 = pNVar7->tag->model;
                      if ((uVar13 & 0xc) != 4) {
                        if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
                           (element->tag->id == TidyTag_A)) {
                          if ((uVar13 >> 0xe & 1) == 0 && pNVar7->tag != (Dict *)0x0) {
LAB_0013ff63:
                            prvTidyPopInline(doc,element);
                          }
                          else if (element->content == (Node *)0x0) {
                            prvTidyDiscardElement(doc,element);
                            prvTidyUngetToken(doc);
                            return;
                          }
                        }
                        goto LAB_0013ff6e;
                      }
                      MoveToHead(doc,element,pNVar7);
                    }
                    else {
                      BVar5 = prvTidynodeIsElement(pNVar7);
                      if (BVar5 == no) goto LAB_0013f6ca;
                      if (pNVar7->implicit != no) {
                        prvTidyReport(doc,element,pNVar7,0x247);
                      }
                      if ((pNVar7->tag != (Dict *)0x0) && (pNVar7->tag->id == TidyTag_BR)) {
                        TrimSpaces(doc,element);
                      }
                      pNVar7->parent = element;
                      pNVar10 = element->last;
                      pNVar7->prev = pNVar10;
                      ppNVar12 = &pNVar10->next;
                      if (pNVar10 == (Node *)0x0) {
                        ppNVar12 = &element->content;
                      }
                      *ppNVar12 = pNVar7;
                      element->last = pNVar7;
                      ParseTag(doc,pNVar7,mode_00);
                    }
                    goto LAB_0013f6ea;
                  }
                  BVar5 = prvTidynodeIsElement(pNVar7);
                  if (BVar5 == no) goto LAB_0013f6ca;
                  prvTidyReport(doc,element,pNVar7,0x27e);
                  pNVar11 = prvTidyInferredTag(doc,TidyTag_DD);
                  pNVar10 = element->content;
                  pNVar4 = element->parent;
                  pNVar11->parent = pNVar4;
                  if (pNVar10 == (Node *)0x0) {
                    pNVar11->next = element;
                    pNVar11->prev = element->prev;
                    element->prev = pNVar11;
                    if (pNVar11->prev != (Node *)0x0) {
                      pNVar11->prev->next = pNVar11;
                    }
                    if (pNVar4->content == element) {
                      pNVar4->content = pNVar11;
                    }
                    pNVar7->parent = pNVar11;
                    pNVar10 = pNVar11->last;
                    pNVar7->prev = pNVar10;
                    ppNVar12 = &pNVar11->content;
                    if (pNVar10 != (Node *)0x0) {
                      ppNVar12 = &pNVar10->next;
                    }
                    *ppNVar12 = pNVar7;
                    pNVar11->last = pNVar7;
                    goto LAB_0013f6ea;
                  }
                  if ((pNVar4 == (Node *)0x0) || (pNVar4->last != element)) {
                    pNVar10 = element->next;
                    pNVar11->next = pNVar10;
                    if (pNVar10 != (Node *)0x0) {
                      ppNVar12 = &pNVar10->prev;
                      goto LAB_0013fd70;
                    }
                  }
                  else {
                    ppNVar12 = &pNVar4->last;
LAB_0013fd70:
                    *ppNVar12 = pNVar11;
                  }
                  element->next = pNVar11;
                  pNVar11->prev = element;
                  pNVar7->parent = pNVar11;
                  pNVar10 = pNVar11->last;
                  ppNVar12 = &pNVar10->next;
                  if (pNVar10 == (Node *)0x0) {
                    ppNVar12 = &pNVar11->content;
                  }
                  pNVar7->prev = pNVar10;
                  *ppNVar12 = pNVar7;
                  pNVar11->last = pNVar7;
                  if (mode != Preformatted) {
                    TrimSpaces(doc,element);
                  }
                  element = prvTidyCloneNode(doc,element);
                  pNVar7 = pNVar11->parent;
                  element->parent = pNVar7;
                  if ((pNVar7 == (Node *)0x0) || (pNVar7->last != pNVar11)) {
                    pNVar7 = pNVar11->next;
                    element->next = pNVar7;
                    if (pNVar7 != (Node *)0x0) {
                      ppNVar12 = &pNVar7->prev;
                      goto LAB_0013fdeb;
                    }
                  }
                  else {
                    ppNVar12 = &pNVar7->last;
LAB_0013fdeb:
                    *ppNVar12 = element;
                  }
                  pNVar11->next = element;
                  element->prev = pNVar11;
                  goto LAB_0013f6ea;
                }
                pDVar8 = pNVar7->tag;
LAB_0013ffeb:
                if (pDVar8 != element->tag) {
                  prvTidyReport(doc,element,pNVar7,0x259);
                  goto LAB_0013ff6e;
                }
LAB_001400af:
                prvTidyReport(doc,element,pNVar7,0x268);
                prvTidyFreeNode(doc,pNVar7);
              }
              else {
                BVar5 = prvTidynodeHasCM(pNVar7,0x10);
                if ((BVar5 == no) ||
                   ((((pNVar7->tag != (Dict *)0x0 && (pNVar7->tag->id == TidyTag_A)) ||
                     (BVar5 = prvTidynodeHasCM(pNVar7,0x800), BVar5 != no)) ||
                    (BVar5 = prvTidynodeHasCM(element,0x10), BVar5 == no)))) {
                  if ((pLVar2->exiled != no) &&
                     ((BVar5 = prvTidynodeHasCM(pNVar7,0x80), BVar5 != no ||
                      ((pNVar7->tag != (Dict *)0x0 && (pNVar7->tag->id == TidyTag_TABLE)))))) {
                    prvTidyUngetToken(doc);
                    goto LAB_0013ff17;
                  }
                  goto LAB_0013f7b9;
                }
                if ((((((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
                      (element->tag->id == TidyTag_A)) ||
                     ((pNVar7->tag == element->tag ||
                      (BVar5 = prvTidyIsPushed(doc,pNVar7), BVar5 == no)))) ||
                    (BVar5 = prvTidyIsPushed(doc,element), BVar5 == no)) ||
                   (BVar5 = prvTidySwitchInline(doc,element,pNVar7), BVar5 == no)) {
                  prvTidyPopInline(doc,element);
                  if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
                     (element->tag->id == TidyTag_A)) goto LAB_0013f6ca;
                  pDVar8 = pNVar7->tag;
                  if ((pDVar8 != (Dict *)0x0) && (pDVar8->id == TidyTag_A)) goto LAB_0013ffeb;
                  goto LAB_001400af;
                }
                prvTidyReport(doc,element,pNVar7,0x268);
                prvTidyUngetToken(doc);
                prvTidyInlineDup1(doc,(Node *)0x0,element);
              }
LAB_0013ff76:
              if (mode == Preformatted) {
                return;
              }
LAB_0013ff17:
              TrimSpaces(doc,element);
              return;
            }
          }
LAB_0013f6ca:
          prvTidyReport(doc,element,pNVar7,0x235);
        }
        else {
          if ((mode != Preformatted) && (element->content == (Node *)0x0)) {
            TrimSpaces(doc,element);
          }
          if (pNVar7->start < pNVar7->end) {
            pNVar7->parent = element;
            pNVar10 = element->last;
            pNVar7->prev = pNVar10;
            ppNVar12 = &pNVar10->next;
            if (pNVar10 == (Node *)0x0) {
              ppNVar12 = &element->content;
            }
            *ppNVar12 = pNVar7;
LAB_0013f4c6:
            element->last = pNVar7;
            goto LAB_0013f6ea;
          }
        }
        prvTidyFreeNode(doc,pNVar7);
      }
LAB_0013f6ea:
      pNVar7 = prvTidyGetToken(doc,mode_00);
    }
    if ((element->tag->model & 0x8000) == 0) {
      prvTidyReport(doc,element,(Node *)0x0,0x25a);
      return;
    }
  }
  return;
}

Assistant:

void TY_(ParseInline)( TidyDocImpl* doc, Node *element, GetTokenMode mode )
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_inline = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node, *parent;
#if defined(ENABLE_DEBUG_LOG)
    in_parse_inline++;
    SPRTF("Entering ParseInline %d...\n",in_parse_inline);
#endif

    if (element->tag->model & CM_EMPTY) {
#if defined(ENABLE_DEBUG_LOG)
        in_parse_inline--;
        SPRTF("Exit ParseInline 1 %d...\n",in_parse_inline);
#endif
        return;
    }

    /*
     ParseInline is used for some block level elements like H1 to H6
     For such elements we need to insert inline emphasis tags currently
     on the inline stack. For Inline elements, we normally push them
     onto the inline stack provided they aren't implicit or OBJECT/APPLET.
     This test is carried out in PushInline and PopInline, see istack.c

     InlineDup(...) is not called for elements with a CM_MIXED (inline and
     block) content model, e.g. <del> or <ins>, otherwise constructs like 

       <p>111<a name='foo'>222<del>333</del>444</a>555</p>
       <p>111<span>222<del>333</del>444</span>555</p>
       <p>111<em>222<del>333</del>444</em>555</p>

     will get corrupted.
    */
    if ((TY_(nodeHasCM)(element, CM_BLOCK) || nodeIsDT(element)) &&
        !TY_(nodeHasCM)(element, CM_MIXED))
        TY_(InlineDup)(doc, NULL);
    else if (TY_(nodeHasCM)(element, CM_INLINE))
        TY_(PushInline)(doc, element);

    if ( nodeIsNOBR(element) )
        doc->badLayout |= USING_NOBR;
    else if ( nodeIsFONT(element) )
        doc->badLayout |= USING_FONT;

    /* Inline elements may or may not be within a preformatted element */
    if (mode != Preformatted)
        mode = MixedContent;

    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        /* end tag for current element */
        if (node->tag == element->tag && node->type == EndTag)
        {
            if (element->tag->model & CM_INLINE)
                TY_(PopInline)( doc, node );

            TY_(FreeNode)( doc, node );

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

            /*
             if a font element wraps an anchor and nothing else
             then move the font element inside the anchor since
             otherwise it won't alter the anchor text color
            */
            if ( nodeIsFONT(element) && 
                 element->content && element->content == element->last )
            {
                Node *child = element->content;

                if ( nodeIsA(child) )
                {
                    child->parent = element->parent;
                    child->next = element->next;
                    child->prev = element->prev;

                    element->next = NULL;
                    element->prev = NULL;
                    element->parent = child;

                    element->content = child->content;
                    element->last = child->last;
                    child->content = element;

                    TY_(FixNodeLinks)(child);
                    TY_(FixNodeLinks)(element);
                }
            }

            element->closed = yes;
            TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 2 %d...\n",in_parse_inline);
#endif
            return;
        }

        /* <u>...<u>  map 2nd <u> to </u> if 1st is explicit */
        /* (see additional conditions below) */
        /* otherwise emphasis nesting is probably unintentional */
        /* big, small, sub, sup have cumulative effect to leave them alone */
        if ( node->type == StartTag
             && node->tag == element->tag
             && TY_(IsPushed)( doc, node )
             && !node->implicit
             && !element->implicit
             && node->tag && (node->tag->model & CM_INLINE)
             && !nodeIsA(node)
             && !nodeIsFONT(node)
             && !nodeIsBIG(node)
             && !nodeIsSMALL(node)
             && !nodeIsSUB(node)
             && !nodeIsSUP(node)
             && !nodeIsQ(node)
             && !nodeIsSPAN(node)
             && cfgBool(doc, TidyCoerceEndTags)
           )
        {
            /* proceeds only if "node" does not have any attribute and
               follows a text node not finishing with a space */
            if (element->content != NULL && node->attributes == NULL
                && TY_(nodeIsText)(element->last)
                && !TY_(TextNodeEndWithSpace)(doc->lexer, element->last) )
            {
                TY_(Report)(doc, element, node, COERCE_TO_ENDTAG);
                node->type = EndTag;
                TY_(UngetToken)(doc);
                continue;
            }

            if (node->attributes == NULL || element->attributes == NULL)
                TY_(Report)(doc, element, node, NESTED_EMPHASIS);
        }
        else if ( TY_(IsPushed)(doc, node) && node->type == StartTag && 
                  nodeIsQ(node) )
        {
            /*\
             * Issue #215 - such nested quotes are NOT a problem if HTML5, so
             * only issue this warning if NOT HTML5 mode.
            \*/
            if (TY_(HTMLVersion)(doc) != HT50) 
            {
                TY_(Report)(doc, element, node, NESTED_QUOTATION);
            }
        }

        if ( TY_(nodeIsText)(node) )
        {
            /* only called for 1st child */
            if ( element->content == NULL && !(mode & Preformatted) )
                TrimSpaces( doc, element );

            if ( node->start >= node->end )
            {
                TY_(FreeNode)( doc, node );
                continue;
            }

            TY_(InsertNodeAtEnd)(element, node);
            continue;
        }

        /* mixed content model so allow text */
        if (InsertMisc(element, node))
            continue;

        /* deal with HTML tags */
        if ( nodeIsHTML(node) )
        {
            if ( TY_(nodeIsElement)(node) )
            {
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }

            /* otherwise infer end of inline element */
            TY_(UngetToken)( doc );

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);
#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 3 %d...\n",in_parse_inline);
#endif
            return;
        }

        /* within <dt> or <pre> map <p> to <br> */
        if ( nodeIsP(node) &&
             node->type == StartTag &&
             ( (mode & Preformatted) ||
               nodeIsDT(element) || 
               DescendantOf(element, TidyTag_DT )
             )
           )
        {
            node->tag = TY_(LookupTagDef)( TidyTag_BR );
            TidyDocFree(doc, node->element);
            node->element = TY_(tmbstrdup)(doc->allocator, "br");
            TrimSpaces(doc, element);
            TY_(InsertNodeAtEnd)(element, node);
            continue;
        }

        /* <p> allowed within <address> in HTML 4.01 Transitional */
        if ( nodeIsP(node) &&
             node->type == StartTag &&
             nodeIsADDRESS(element) )
        {
            TY_(ConstrainVersion)( doc, ~VERS_HTML40_STRICT );
            TY_(InsertNodeAtEnd)(element, node);
            (*node->tag->parser)( doc, node, mode );
            continue;
        }

        /* ignore unknown and PARAM tags */
        if ( node->tag == NULL || nodeIsPARAM(node) )
        {
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node );
            continue;
        }

        if ( nodeIsBR(node) && node->type == EndTag )
            node->type = StartTag;

        if ( node->type == EndTag )
        {
           /* coerce </br> to <br> */
           if ( nodeIsBR(node) )
                node->type = StartTag;
           else if ( nodeIsP(node) )
           {
               /* coerce unmatched </p> to <br><br> */
                if ( !DescendantOf(element, TidyTag_P) )
                {
                    TY_(CoerceNode)(doc, node, TidyTag_BR, no, no);
                    TrimSpaces( doc, element );
                    TY_(InsertNodeAtEnd)( element, node );
                    node = TY_(InferredTag)(doc, TidyTag_BR);
                    TY_(InsertNodeAtEnd)( element, node ); /* todo: check this */
                    continue;
                }
           }
           else if ( TY_(nodeHasCM)(node, CM_INLINE)
                     && !nodeIsA(node)
                     && !TY_(nodeHasCM)(node, CM_OBJECT)
                     && TY_(nodeHasCM)(element, CM_INLINE) )
            {
                /* allow any inline end tag to end current element */

                /* http://tidy.sf.net/issue/1426419 */
                /* but, like the browser, retain an earlier inline element.
                   This is implemented by setting the lexer into a mode
                   where it gets tokens from the inline stack rather than
                   from the input stream. Check if the scenerio fits. */
                if ( !nodeIsA(element)
                     && (node->tag != element->tag)
                     && TY_(IsPushed)( doc, node )
                     && TY_(IsPushed)( doc, element ) )
                {
                    /* we have something like
                       <b>bold <i>bold and italic</b> italics</i> */
                    if ( TY_(SwitchInline)( doc, element, node ) )
                    {
                        TY_(Report)(doc, element, node, NON_MATCHING_ENDTAG);
                        TY_(UngetToken)( doc ); /* put this back */
                        TY_(InlineDup1)( doc, NULL, element ); /* dupe the <i>, after </b> */
                        if (!(mode & Preformatted))
                            TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                        in_parse_inline--;
                        SPRTF("Exit ParseInline 4 %d...\n",in_parse_inline);
#endif
                        return; /* close <i>, but will re-open it, after </b> */
                    }
                }
                TY_(PopInline)( doc, element );

                if ( !nodeIsA(element) )
                {
                    if ( nodeIsA(node) && node->tag != element->tag )
                    {
                       TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );
                       TY_(UngetToken)( doc );
                    }
                    else
                    {
                        TY_(Report)(doc, element, node, NON_MATCHING_ENDTAG);
                        TY_(FreeNode)( doc, node);
                    }

                    if (!(mode & Preformatted))
                        TrimSpaces(doc, element);
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_inline--;
                    SPRTF("Exit ParseInline 5 %d...\n",in_parse_inline);
#endif
                    return;
                }

                /* if parent is <a> then discard unexpected inline end tag */
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }  /* special case </tr> etc. for stuff moved in front of table */
            else if ( lexer->exiled
                     && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
            {
                TY_(UngetToken)( doc );
                TrimSpaces(doc, element);
#if defined(ENABLE_DEBUG_LOG)
                in_parse_inline--;
                SPRTF("Exit ParseInline 6 %d...\n",in_parse_inline);
#endif
                return;
            }
        }

        /* allow any header tag to end current header */
        if ( TY_(nodeHasCM)(node, CM_HEADING) && TY_(nodeHasCM)(element, CM_HEADING) )
        {

            if ( node->tag == element->tag )
            {
                TY_(Report)(doc, element, node, NON_MATCHING_ENDTAG );
                TY_(FreeNode)( doc, node);
            }
            else
            {
                TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );
                TY_(UngetToken)( doc );
            }

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 7 %d...\n",in_parse_inline);
#endif
            return;
        }

        /*
           an <A> tag to ends any open <A> element
           but <A href=...> is mapped to </A><A href=...>
        */
        /* #427827 - fix by Randy Waki and Bjoern Hoehrmann 23 Aug 00 */
        /* if (node->tag == doc->tags.tag_a && !node->implicit && TY_(IsPushed)(doc, node)) */
        if ( nodeIsA(node) && !node->implicit && 
             (nodeIsA(element) || DescendantOf(element, TidyTag_A)) )
        {
            /* coerce <a> to </a> unless it has some attributes */
            /* #427827 - fix by Randy Waki and Bjoern Hoehrmann 23 Aug 00 */
            /* other fixes by Dave Raggett */
            /* if (node->attributes == NULL) */
            if (node->type != EndTag && node->attributes == NULL
                && cfgBool(doc, TidyCoerceEndTags) )
            {
                node->type = EndTag;
                TY_(Report)(doc, element, node, COERCE_TO_ENDTAG);
                /* TY_(PopInline)( doc, node ); */
                TY_(UngetToken)( doc );
                continue;
            }

            TY_(UngetToken)( doc );
            TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);
            /* TY_(PopInline)( doc, element ); */

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 8 %d...\n",in_parse_inline);
#endif
            return;
        }

        if (element->tag->model & CM_HEADING)
        {
            if ( nodeIsCENTER(node) || nodeIsDIV(node) )
            {
                if (!TY_(nodeIsElement)(node))
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                TY_(Report)(doc, element, node, TAG_NOT_ALLOWED_IN);

                /* insert center as parent if heading is empty */
                if (element->content == NULL)
                {
                    InsertNodeAsParent(element, node);
                    continue;
                }

                /* split heading and make center parent of 2nd part */
                TY_(InsertNodeAfterElement)(element, node);

                if (!(mode & Preformatted))
                    TrimSpaces(doc, element);

                element = TY_(CloneNode)( doc, element );
                TY_(InsertNodeAtEnd)(node, element);
                continue;
            }

            if ( nodeIsHR(node) )
            {
                if ( !TY_(nodeIsElement)(node) )
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                TY_(Report)(doc, element, node, TAG_NOT_ALLOWED_IN);

                /* insert hr before heading if heading is empty */
                if (element->content == NULL)
                {
                    TY_(InsertNodeBeforeElement)(element, node);
                    continue;
                }

                /* split heading and insert hr before 2nd part */
                TY_(InsertNodeAfterElement)(element, node);

                if (!(mode & Preformatted))
                    TrimSpaces(doc, element);

                element = TY_(CloneNode)( doc, element );
                TY_(InsertNodeAfterElement)(node, element);
                continue;
            }
        }

        if ( nodeIsDT(element) )
        {
            if ( nodeIsHR(node) )
            {
                Node *dd;
                if ( !TY_(nodeIsElement)(node) )
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                TY_(Report)(doc, element, node, TAG_NOT_ALLOWED_IN);
                dd = TY_(InferredTag)(doc, TidyTag_DD);

                /* insert hr within dd before dt if dt is empty */
                if (element->content == NULL)
                {
                    TY_(InsertNodeBeforeElement)(element, dd);
                    TY_(InsertNodeAtEnd)(dd, node);
                    continue;
                }

                /* split dt and insert hr within dd before 2nd part */
                TY_(InsertNodeAfterElement)(element, dd);
                TY_(InsertNodeAtEnd)(dd, node);

                if (!(mode & Preformatted))
                    TrimSpaces(doc, element);

                element = TY_(CloneNode)( doc, element );
                TY_(InsertNodeAfterElement)(dd, element);
                continue;
            }
        }


        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            for (parent = element->parent;
                    parent != NULL; parent = parent->parent)
            {
                if (node->tag == parent->tag)
                {
                    if (!(element->tag->model & CM_OPT) && !element->implicit)
                        TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);

                    if( TY_(IsPushedLast)( doc, element, node ) ) 
                        TY_(PopInline)( doc, element );
                    TY_(UngetToken)( doc );

                    if (!(mode & Preformatted))
                        TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
                    in_parse_inline--;
                    SPRTF("Exit ParseInline 9 %d...\n",in_parse_inline);
#endif
                    return;
                }
            }
        }

        /*\
         *  block level tags end this element 
         *  Issue #333 - There seems an exception if the element is a 'span',
         *  and the node just collected is a 'meta'. The 'meta' can not have
         *  CM_INLINE added, nor can the 'span' have CM_MIXED added without
         *  big consequences.
         *  There may be other exceptions to be added...
        \*/
        if (!(node->tag->model & CM_INLINE) &&
            !(element->tag->model & CM_MIXED) &&
            !(nodeIsSPAN(element) && nodeIsMETA(node)) )
        {
            if ( !TY_(nodeIsElement)(node) )
            {
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }
            /* HTML5 */
            if (nodeIsDATALIST(element)) {
                TY_(ConstrainVersion)( doc, ~VERS_HTML5 );
            } else
            if (!(element->tag->model & CM_OPT))
                TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);

            if (node->tag->model & CM_HEAD && !(node->tag->model & CM_BLOCK))
            {
                MoveToHead(doc, element, node);
                continue;
            }

            /*
               prevent anchors from propagating into block tags
               except for headings h1 to h6
            */
            if ( nodeIsA(element) )
            {
                if (node->tag && !(node->tag->model & CM_HEADING))
                    TY_(PopInline)( doc, element );
                else if (!(element->content))
                {
                    TY_(DiscardElement)( doc, element );
                    TY_(UngetToken)( doc );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_inline--;
                    SPRTF("Exit ParseInline 10 %d...\n",in_parse_inline);
#endif
                    return;
                }
            }

            TY_(UngetToken)( doc );

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 11 %d...\n",in_parse_inline);
#endif
            return;
        }

        /* parse inline element */
        if (TY_(nodeIsElement)(node))
        {
            if (node->implicit)
                TY_(Report)(doc, element, node, INSERTING_TAG);

            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces(doc, element);
            
            TY_(InsertNodeAtEnd)(element, node);
            ParseTag(doc, node, mode);
            continue;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node );
        continue;
    }

    if (!(element->tag->model & CM_OPT))
        TY_(Report)(doc, element, node, MISSING_ENDTAG_FOR);

#if defined(ENABLE_DEBUG_LOG)
    in_parse_inline--;
    SPRTF("Exit ParseInline 12 %d...\n",in_parse_inline);
#endif
}